

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O3

void __thiscall iqxmlrpc::BuilderBase::do_visit_text(BuilderBase *this,string *param_1)

{
  XML_RPC_violation *this_00;
  string sStack_38;
  
  if (this->expect_text_ != true) {
    return;
  }
  this_00 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
  Parser::context_abi_cxx11_(&sStack_38,this->parser_);
  XML_RPC_violation::XML_RPC_violation(this_00,&sStack_38);
  __cxa_throw(this_00,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
BuilderBase::do_visit_text(const std::string&)
{
  if (expect_text_) {
    // proper handler was not implemented
    throw XML_RPC_violation(parser_.context());
  }
}